

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

void __thiscall wasm::anon_unknown_0::HeapTypeInfo::~HeapTypeInfo(HeapTypeInfo *this)

{
  HeapTypeKind HVar1;
  
  HVar1 = this->kind;
  if ((1 < HVar1 - Array) && (HVar1 != Func)) {
    if (HVar1 == Struct) {
      std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
                ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)
                 &(this->field_9).signature);
      return;
    }
    handle_unreachable("unexpected kind",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                       ,0x1e4);
  }
  return;
}

Assistant:

HeapTypeInfo::~HeapTypeInfo() {
  switch (kind) {
    case HeapTypeKind::Func:
      signature.~Signature();
      return;
    case HeapTypeKind::Cont:
      continuation.~Continuation();
      return;
    case HeapTypeKind::Struct:
      struct_.~Struct();
      return;
    case HeapTypeKind::Array:
      array.~Array();
      return;
    case HeapTypeKind::Basic:
      break;
  }
  WASM_UNREACHABLE("unexpected kind");
}